

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int binsertch(bstring b,int pos,int len,uchar fill)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  iVar5 = -1;
  if ((((b != (bstring)0x0 && -1 < pos) && (uVar1 = b->slen, -1 < (int)uVar1)) &&
      ((int)uVar1 <= b->mlen)) && (-1 < len && b->mlen != 0)) {
    iVar5 = len + pos;
    if (uVar1 < (uint)pos) {
      iVar2 = balloc(b,iVar5 + 1);
      if (iVar2 != 0) {
        return -1;
      }
      pos = b->slen;
      iVar2 = iVar5;
    }
    else {
      iVar2 = len + uVar1;
      iVar3 = balloc(b,iVar2 + 1);
      if (iVar3 != 0) {
        return -1;
      }
      if ((uint)pos < uVar1) {
        lVar4 = (long)iVar2;
        do {
          b->data[lVar4 + -1] = b->data[(lVar4 + -1) - (ulong)(uint)len];
          lVar4 = lVar4 + -1;
        } while (iVar5 < lVar4);
      }
    }
    b->slen = iVar2;
    if (pos < iVar5) {
      lVar4 = (long)pos;
      do {
        b->data[lVar4] = fill;
        lVar4 = lVar4 + 1;
      } while (iVar5 != lVar4);
      iVar2 = b->slen;
    }
    b->data[iVar2] = '\0';
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int binsertch (bstring b, int pos, int len, unsigned char fill) {
int d, l, i;

	if (pos < 0 || b == NULL || b->slen < 0 || b->mlen < b->slen ||
	    b->mlen <= 0 || len < 0) return BSTR_ERR;

	/* Compute the two possible end pointers */
	d = b->slen + len;
	l = pos + len;
	if ((d|l) < 0) return BSTR_ERR;

	if (l > d) {
		/* Inserting past the end of the string */
		if (balloc (b, l + 1) != BSTR_OK) return BSTR_ERR;
		pos = b->slen;
		b->slen = l;
	} else {
		/* Inserting in the middle of the string */
		if (balloc (b, d + 1) != BSTR_OK) return BSTR_ERR;
		for (i = d - 1; i >= l; i--) {
			b->data[i] = b->data[i - len];
		}
		b->slen = d;
	}

	for (i=pos; i < l; i++) b->data[i] = fill;
	b->data[b->slen] = (unsigned char) '\0';
	return BSTR_OK;
}